

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.hpp
# Opt level: O2

void __thiscall
helics::InputInfo::sourceInformation::sourceInformation
          (sourceInformation *this,string_view key_,string_view type_,string_view units_)

{
  allocator<char> local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = key_._M_str;
  local_28._M_len = key_._M_len;
  local_38._M_str = type_._M_str;
  local_38._M_len = type_._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)this,&local_28,&local_39);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->type,&local_38,&local_39);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->units,(basic_string_view<char,_std::char_traits<char>_> *)&units_,
             &local_39);
  return;
}

Assistant:

sourceInformation(std::string_view key_, std::string_view type_, std::string_view units_):
            key(key_), type(type_), units(units_)
        {
        }